

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
PatchNewGame::build_flag_array
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          PatchNewGame *this,World *world)

{
  byte *pbVar1;
  pointer pFVar2;
  byte bVar3;
  byte bVar4;
  Flag *flag;
  pointer pFVar5;
  mapped_type *ppIVar6;
  long lVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  key_type_conflict local_3b;
  key_type_conflict local_3a;
  value_type_conflict local_39;
  PatchNewGame *local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_39 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (__return_storage_ptr__,0x80,&local_39);
  pFVar2 = (world->_starting_flags).super__Vector_base<Flag,_std::allocator<Flag>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar5 = (world->_starting_flags).super__Vector_base<Flag,_std::allocator<Flag>_>._M_impl.
                super__Vector_impl_data._M_start; pFVar5 != pFVar2; pFVar5 = pFVar5 + 1) {
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + (byte)pFVar5->byte;
    *pbVar1 = *pbVar1 | (byte)(1 << (pFVar5->bit & 0x1f));
  }
  lVar7 = 0x40;
  uVar10 = 0;
  local_38 = this;
  do {
    local_3b = (key_type_conflict)uVar10;
    ppIVar6 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at(&world->_items,&local_3b);
    bVar4 = (*ppIVar6)->_max_quantity;
    bVar8 = (*ppIVar6)->_starting_quantity;
    local_3a = (key_type_conflict)uVar10 + '\x01';
    ppIVar6 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at(&world->_items,&local_3a);
    if (bVar4 < bVar8) {
      bVar8 = bVar4;
    }
    bVar4 = 0;
    bVar9 = 0;
    if (bVar8 != 0) {
      bVar9 = bVar8 + 1 & 0xf;
    }
    bVar8 = (*ppIVar6)->_max_quantity;
    bVar3 = (*ppIVar6)->_starting_quantity;
    if (bVar8 < bVar3) {
      bVar3 = bVar8;
    }
    if (bVar3 != 0) {
      bVar4 = bVar3 * '\x10' + 0x10;
    }
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start[lVar7] = bVar4 | bVar9;
    lVar7 = lVar7 + 1;
    bVar11 = uVar10 < 0x3c;
    uVar10 = uVar10 + 2;
  } while (bVar11);
  if (local_38->_add_ingame_tracker != false) {
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x4b;
    *pbVar1 = *pbVar1 | 0x10;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x4c;
    *pbVar1 = *pbVar1 | 0x10;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x4d;
    *pbVar1 = *pbVar1 | 0x11;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x4f;
    *pbVar1 = *pbVar1 | 0x11;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x50;
    *pbVar1 = *pbVar1 | 1;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x55;
    *pbVar1 = *pbVar1 | 0x10;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x57;
    *pbVar1 = *pbVar1 | 0x10;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x58;
    *pbVar1 = *pbVar1 | 0x10;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x59;
    *pbVar1 = *pbVar1 | 0x11;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x5b;
    *pbVar1 = *pbVar1 | 0x10;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start + 0x5c;
    *pbVar1 = *pbVar1 | 0x11;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::vector<uint8_t> build_flag_array(const World& world) const
    {
        std::vector<uint8_t> flag_array;
        flag_array.resize(0x80, 0x00);

        // Apply starting flags
        for(const Flag& flag : world.starting_flags())
            flag_array[(uint8_t)flag.byte] |= (1 << flag.bit);

        // Apply starting inventory
        for(uint8_t item_id=0 ; item_id < ITEM_LIFESTOCK ; item_id += 0x2)
        {
            uint8_t inventory_flag_value = 0x00;

            uint8_t lsh_quantity = world.item(item_id)->starting_quantity();
            if(lsh_quantity)
                inventory_flag_value |= (lsh_quantity+1) & 0x0F;

            uint8_t msh_quantity = world.item(item_id+1)->starting_quantity();
            if(msh_quantity)
                inventory_flag_value |= ((msh_quantity+1) & 0x0F) << 4;

            flag_array[0x40 + (item_id / 2)] = inventory_flag_value;
        }

        if(_add_ingame_tracker)
        {
            // The ingame-tracker consists in putting in "grayed-out" key items in the inventory,
            // as if they were already obtained but lost (like lithograph in OG)
            flag_array[0x4B] |= 0x10;
            flag_array[0x4C] |= 0x10;
            flag_array[0x4D] |= 0x11;
            flag_array[0x4F] |= 0x11;
            flag_array[0x50] |= 0x01;
            flag_array[0x55] |= 0x10;
            flag_array[0x57] |= 0x10;
            flag_array[0x58] |= 0x10;
            flag_array[0x59] |= 0x11;
            flag_array[0x5B] |= 0x10;
            flag_array[0x5C] |= 0x11;
        }

        return flag_array;
    }